

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O3

void __thiscall
cmCTestCVS::WriteXMLDirectory(cmCTestCVS *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pRVar3;
  pointer pRVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  size_type *psVar7;
  Revision *this_00;
  cmCTestCVS *this_01;
  string branchFlag;
  File f;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> revisions;
  string full;
  string local_d8;
  File local_b8;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> local_98;
  cmCTestCVS *local_78;
  value_type *local_70;
  string local_68;
  string *local_48;
  _Rb_tree_node_base *local_40;
  char *local_38;
  
  local_38 = "/";
  if (path->_M_string_length == 0) {
    local_38 = "";
  }
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_78 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Directory","");
  cmXMLWriter::StartElement(xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Name","");
  cmXMLWriter::StartElement(xml,&local_d8);
  cmXMLWriter::Content<std::__cxx11::string>(xml,path);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  this_01 = local_78;
  ComputeBranchFlag(&local_d8,local_78,path);
  local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_start = (Revision *)0x0;
  local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_finish = (Revision *)0x0;
  local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (dir->
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(dir->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_40) {
    local_70 = &(this_01->super_cmCTestVC).Unknown;
    local_48 = path;
    do {
      pcVar2 = (path->_M_dataplus)._M_p;
      local_b8._0_8_ = &local_b8.PriorRev;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + path->_M_string_length);
      std::__cxx11::string::append((char *)&local_b8);
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,*(ulong *)(p_Var6 + 1));
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68.field_2._8_8_ = plVar5[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_68._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((Revision **)local_b8._0_8_ != &local_b8.PriorRev) {
        operator_delete((void *)local_b8._0_8_,
                        (ulong)((long)&((local_b8.PriorRev)->Rev)._M_dataplus._M_p + 1));
      }
      pRVar4 = local_98.
               super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pRVar3 = local_98.
               super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl
               .super__Vector_impl_data._M_start;
      this_00 = local_98.
                super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          cmCTestVC::Revision::~Revision(this_00);
          this_00 = this_00 + 1;
        } while (this_00 != pRVar4);
        local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
        _M_impl.super__Vector_impl_data._M_finish = pRVar3;
        this_01 = local_78;
      }
      if (p_Var6[2]._M_color != _S_red) {
        std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
                  (&local_98,local_70);
      }
      LoadRevisions(this_01,&local_68,local_d8._M_dataplus._M_p,&local_98);
      std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::resize
                (&local_98,2,local_70);
      path = local_48;
      local_b8.Status = p_Var6[2]._M_color;
      local_b8.Rev = local_98.
                     super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_b8.PriorRev =
           local_98.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      cmCTestVC::WriteXMLEntry
                (&this_01->super_cmCTestVC,xml,local_48,(string *)(p_Var6 + 1),&local_68,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_40);
  }
  cmXMLWriter::EndElement(xml);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCVS::WriteXMLDirectory(cmXMLWriter& xml, std::string const& path,
                                   Directory const& dir)
{
  const char* slash = path.empty() ? "" : "/";
  xml.StartElement("Directory");
  xml.Element("Name", path);

  // Lookup the branch checked out in the working tree.
  std::string branchFlag = this->ComputeBranchFlag(path);

  // Load revisions and write an entry for each file in this directory.
  std::vector<Revision> revisions;
  for (auto const& fi : dir) {
    std::string full = path + slash + fi.first;

    // Load two real or unknown revisions.
    revisions.clear();
    if (fi.second != PathUpdated) {
      // For local modifications the current rev is unknown and the
      // prior rev is the latest from cvs.
      revisions.push_back(this->Unknown);
    }
    this->LoadRevisions(full, branchFlag.c_str(), revisions);
    revisions.resize(2, this->Unknown);

    // Write the entry for this file with these revisions.
    File f(fi.second, revisions.data(), revisions.data() + 1);
    this->WriteXMLEntry(xml, path, fi.first, full, f);
  }
  xml.EndElement(); // Directory
}